

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O2

int av1_handle_inter_intra_mode
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MB_MODE_INFO *mbmi,
              HandleInterModeArgs *args,int64_t ref_best_rd,int *rate_mv,int *tmp_rate2,
              BUFFER_SET *orig_dst)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  macroblockd_plane *pmVar4;
  MACROBLOCK *xd;
  long lVar5;
  int64_t iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  BLOCK_SIZE BVar10;
  undefined7 in_register_00000011;
  int_mv iVar11;
  AV1_COMP *pAVar12;
  RD_STATS *rd_stats;
  BUFFER_SET *pBVar13;
  INTERINTRA_MODE cur_mode_1;
  buf_2d *pbVar14;
  long lVar15;
  INTERINTRA_MODE cur_mode;
  INTERINTRA_MODE IVar16;
  uint8_t *dst;
  MB_MODE_INFO *mbmi_00;
  int (*interintra_mode_cost) [4];
  long lVar17;
  int64_t *in_stack_ffffffffffffeec8;
  INTERINTRA_MODE local_112b;
  INTERINTRA_MODE best_interintra_mode;
  byte local_1129;
  AV1_COMP *local_1128;
  uint8_t local_1119;
  MACROBLOCK *local_1118;
  int tmp_rate_mv;
  AV1_COMMON *local_1108;
  AV1_COMP *local_1100;
  undefined4 local_10f8;
  int_mv tmp_mv;
  int64_t local_10f0;
  uint8_t *local_10e8;
  ulong local_10e0;
  ulong local_10d8;
  uint8_t skip_txfm_sb;
  HandleInterModeArgs *local_10c8;
  uint8_t *local_10c0;
  long local_10b8;
  int local_10b0;
  int local_10ac;
  AV1_COMP *local_10a8;
  uint8_t *local_10a0;
  int64_t local_1098;
  int_mv local_108c;
  long local_1088;
  MB_MODE_INFO *local_1080;
  int64_t best_interintra_rd;
  uint8_t *puStack_1070;
  uint8_t *local_1068;
  int64_t aiStack_1060 [3];
  int rate_sum;
  int64_t skip_sse_sb;
  uint8_t intrapred_ [2048];
  uint8_t tmp_buf_ [2048];
  
  local_10d8 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  iVar9 = *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                  (ulong)(uint)((int)CONCAT71(in_register_00000011,bsize) << 5));
  local_10b8 = CONCAT44(local_10b8._4_4_,iVar9);
  if ((iVar9 < 1) || (x->source_variance <= (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh))
  {
    local_10f8 = 0;
  }
  else {
    local_10f8 = CONCAT31((int3)(x->source_variance >> 8),
                          (cpi->oxcf).comp_type_cfg.enable_interintra_wedge);
  }
  local_1129 = (cpi->oxcf).comp_type_cfg.enable_smooth_interintra;
  local_1108 = &cpi->common;
  local_1118 = (MACROBLOCK *)&x->e_mbd;
  bVar1 = block_size_wide[local_10d8];
  local_10e0 = (ulong)bVar1;
  uVar3 = ((x->e_mbd).cur_buf)->flags;
  local_10a0 = (uint8_t *)((ulong)tmp_buf_ >> 1);
  if ((uVar3 & 8) == 0) {
    local_10a0 = tmp_buf_;
  }
  local_10e8 = (uint8_t *)((ulong)intrapred_ >> 1);
  local_10ac = (x->e_mbd).mi_row;
  local_10b0 = (x->e_mbd).mi_col;
  mbmi->ref_frame[1] = -1;
  pmVar4 = (x->e_mbd).plane;
  (x->e_mbd).plane[0].dst.buf = local_10a0;
  (x->e_mbd).plane[0].dst.stride = (uint)bVar1;
  local_1128 = (AV1_COMP *)(ulong)bsize;
  rd_stats = (RD_STATS *)0x0;
  local_10f0 = ref_best_rd;
  local_10c8 = args;
  av1_enc_build_inter_predictor
            (local_1108,(MACROBLOCKD *)local_1118,local_10ac,local_10b0,(BUFFER_SET *)0x0,bsize,0,0)
  ;
  local_1119 = ((cpi->common).seq_params)->monochrome;
  aiStack_1060[1] = *(undefined8 *)(orig_dst->stride + 2);
  local_1068 = orig_dst->plane[2];
  aiStack_1060[0] = *(int64_t *)orig_dst->stride;
  best_interintra_rd = (int64_t)orig_dst->plane[0];
  puStack_1070 = orig_dst->plane[1];
  for (lVar5 = 6; pbVar14 = &pmVar4->dst,
      lVar5 + (-(ulong)(local_1119 != '\0') | 0xfffffffffffffffd) != 6; lVar5 = lVar5 + 1) {
    pbVar14->buf = (uint8_t *)(&local_10a8)[lVar5];
    pbVar14->stride = *(int *)((long)&best_interintra_rd + lVar5 * 4);
    pmVar4 = (macroblockd_plane *)(pbVar14 + 0x51);
  }
  dst = local_10e8;
  if ((uVar3 & 8) == 0) {
    dst = intrapred_;
  }
  mbmi->ref_frame[1] = '\0';
  local_112b = local_10c8->inter_intra_mode[mbmi->ref_frame[0]];
  best_interintra_mode = local_112b;
  local_1080 = mbmi;
  if (local_1129 == 0) {
    local_10b8 = 0x7fffffff;
    lVar5 = 0x7fffffffffffffff;
  }
  else {
    bVar1 = ""[local_10d8];
    mbmi->field_0xa8 = mbmi->field_0xa8 & 0xfb;
    interintra_mode_cost = (x->mode_costs).interintra_mode_cost + bVar1;
    local_1100 = (AV1_COMP *)x;
    if (((cpi->sf).inter_sf.reuse_inter_intra_mode == 0) || (local_112b == '\x04')) {
      best_interintra_rd = 0x7fffffffffffffff;
      for (IVar16 = '\0'; IVar16 != '\x04'; IVar16 = IVar16 + '\x01') {
        if ((cpi->oxcf).intra_mode_cfg.enable_smooth_intra == true) {
          if ((IVar16 != '\x03') || ((cpi->sf).intra_sf.disable_smooth_intra == 0)) {
LAB_003469d3:
            compute_best_interintra_mode
                      (cpi,mbmi,(MACROBLOCKD *)local_1118,(MACROBLOCK *)local_1100,
                       *interintra_mode_cost,orig_dst,dst,local_10a0,&best_interintra_mode,
                       &best_interintra_rd,IVar16,(BLOCK_SIZE)local_1128);
          }
        }
        else if (IVar16 != '\x03') goto LAB_003469d3;
      }
      local_10c8->inter_intra_mode[mbmi->ref_frame[0]] = best_interintra_mode;
    }
    xd = local_1118;
    local_112b = best_interintra_mode;
    mbmi->interintra_mode = best_interintra_mode;
    BVar10 = (BLOCK_SIZE)local_1128;
    iVar9 = (int)local_10e0;
    local_10a8 = cpi;
    av1_build_intra_predictors_for_interintra
              (local_1108,(MACROBLOCKD *)local_1118,BVar10,0,orig_dst,dst,iVar9);
    av1_combine_interintra((MACROBLOCKD *)xd,BVar10,0,local_10a0,iVar9,dst,iVar9);
    cpi = local_10a8;
    x = (MACROBLOCK *)local_1100;
    iVar9 = 0;
    if (0 < (int)local_10b8) {
      iVar9 = *(int *)((local_1100->enc_quant_dequant_params).quants.u_round_fp[0x8a] +
                      local_10d8 * 4 + 4);
    }
    local_10b8 = (long)iVar9 + (long)(*interintra_mode_cost)[local_112b];
    lVar17 = *rate_mv + local_10b8;
    lVar5 = 0x7fffffffffffffff;
    if (local_10f0 < 0x47fffffffffffff7) {
      lVar5 = local_10f0 / 9 << 4;
    }
    rd_stats = (RD_STATS *)&best_interintra_rd;
    iVar6 = estimate_yrd_for_sb(local_10a8,(BLOCK_SIZE)local_1128,(MACROBLOCK *)local_1100,
                                lVar5 - (*(int *)((local_1100->enc_quant_dequant_params).quants.
                                                  y_quant_fp[0x20] + 4) * lVar17 + 0x100 >> 9),
                                rd_stats);
    if (iVar6 == 0x7fffffffffffffff) {
      return -1;
    }
    lVar5 = (long)puStack_1070 * 0x80 +
            ((long)*(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4)
             * ((long)(int)lVar17 + (long)(int)best_interintra_rd) + 0x100 >> 9);
    if ((local_10f0 != 0x7fffffffffffffff) && (local_10f0 < (lVar5 >> 4) * 9)) {
      return -1;
    }
  }
  mbmi_00 = local_1080;
  pAVar12 = local_1128;
  tmp_mv = local_1080->mv[0];
  tmp_rate_mv = 0;
  lVar17 = 0;
  local_108c = tmp_mv;
  if ((byte)local_10f8 == '\0') {
    lVar8 = 0x7fffffffffffffff;
    goto LAB_003471b5;
  }
  bVar1 = ""[local_10d8];
  _Var2 = (cpi->oxcf).comp_type_cfg.enable_smooth_interintra;
  *(ushort *)&local_1080->field_0xa7 = *(ushort *)&local_1080->field_0xa7 | 0x400;
  local_1100 = (AV1_COMP *)
               ((((AV1_COMP *)x)->enc_quant_dequant_params).quants.u_round_fp[(ulong)bVar1 + 0x95] +
               4);
  local_10c0 = dst;
  local_1088 = lVar5;
  if ((cpi->sf).inter_sf.fast_interintra_wedge_search == 0) {
    if ((*(byte *)(*(long *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_zbin[10] + 4) +
                  0xc0) & 8) == 0) {
      local_10e8 = intrapred_;
    }
    IVar16 = '\0';
    local_10c8 = (HandleInterModeArgs *)0x0;
    lVar17 = 0;
    lVar5 = 0x7fffffffffffffff;
    local_10f0 = 0x7fffffffffffffff;
    local_10a8 = cpi;
    while( true ) {
      dst = local_10c0;
      pAVar12 = local_1128;
      if (lVar17 == 4) break;
      mbmi_00->interintra_mode = (INTERINTRA_MODE)lVar17;
      pBVar13 = orig_dst;
      av1_build_intra_predictors_for_interintra
                (local_1108,(MACROBLOCKD *)local_1118,(BLOCK_SIZE)local_1128,0,orig_dst,local_10e8,
                 (int)local_10e0);
      mbmi_00 = local_1080;
      iVar6 = pick_interintra_wedge
                        ((AV1_COMP *)x,(MACROBLOCK *)((ulong)pAVar12 & 0xffffffff),
                         (BLOCK_SIZE)intrapred_,tmp_buf_,(uint8_t *)pBVar13);
      lVar8 = ((long)*(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant_fp[0x20] +
                             4) *
               ((long)*(int *)((long)(((AV1_COMP *)x)->enc_quant_dequant_params).quants.u_round_fp
                                     [0x30] +
                              (long)mbmi_00->interintra_wedge_index * 4 +
                              (ulong)(uint)((int)local_10d8 << 6) + 8) +
               (long)*(int *)((long)local_1100 + lVar17 * 2 * 2)) + 0x100 >> 9) + iVar6;
      if (lVar8 < lVar5) {
        IVar16 = mbmi_00->interintra_mode;
        lVar5 = lVar8;
        local_10f0 = iVar6;
        local_10c8 = (HandleInterModeArgs *)(long)mbmi_00->interintra_wedge_index;
      }
      lVar17 = lVar17 + 1;
    }
    local_1098 = local_10f0;
    mbmi_00->interintra_mode = IVar16;
    mbmi_00->interintra_wedge_index = (int8_t)local_10c8;
    cpi = local_10a8;
    if (IVar16 != '\x03') {
      av1_build_intra_predictors_for_interintra
                (local_1108,(MACROBLOCKD *)local_1118,(BLOCK_SIZE)local_1128,0,orig_dst,local_10c0,
                 (int)local_10e0);
      cpi = local_10a8;
    }
  }
  else {
    if (_Var2 == false) {
      if (local_112b == '\x04') {
        local_1080->interintra_mode = '\x03';
        best_interintra_mode = '\x03';
        pBVar13 = orig_dst;
        av1_build_intra_predictors_for_interintra
                  (local_1108,(MACROBLOCKD *)local_1118,(BLOCK_SIZE)local_1128,0,orig_dst,dst,
                   (int)local_10e0);
        local_1098 = pick_interintra_wedge
                               ((AV1_COMP *)x,(MACROBLOCK *)local_1128,(BLOCK_SIZE)intrapred_,
                                tmp_buf_,(uint8_t *)pBVar13);
        for (IVar16 = '\0'; IVar16 != '\x04'; IVar16 = IVar16 + '\x01') {
          compute_best_interintra_mode
                    (cpi,mbmi_00,(MACROBLOCKD *)local_1118,x,(int *)local_1100,orig_dst,dst,
                     local_10a0,&best_interintra_mode,&local_1098,IVar16,(BLOCK_SIZE)local_1128);
        }
        IVar16 = best_interintra_mode;
        local_10c8->inter_intra_mode[mbmi_00->ref_frame[0]] = best_interintra_mode;
        mbmi_00->interintra_mode = best_interintra_mode;
        local_112b = '\x03';
        if (best_interintra_mode != '\x03') {
          av1_build_intra_predictors_for_interintra
                    (local_1108,(MACROBLOCKD *)local_1118,(BLOCK_SIZE)local_1128,0,orig_dst,dst,
                     (int)local_10e0);
          local_112b = IVar16;
        }
        goto LAB_00346ed4;
      }
      local_1080->interintra_mode = local_112b;
      rd_stats = (RD_STATS *)orig_dst;
      av1_build_intra_predictors_for_interintra
                (local_1108,(MACROBLOCKD *)local_1118,(BLOCK_SIZE)local_1128,0,orig_dst,dst,
                 (int)local_10e0);
      BVar10 = (BLOCK_SIZE)intrapred_;
      pAVar12 = (AV1_COMP *)((ulong)pAVar12 & 0xffffffff);
    }
    else {
      BVar10 = (BLOCK_SIZE)intrapred_;
    }
    local_1098 = pick_interintra_wedge
                           ((AV1_COMP *)x,(MACROBLOCK *)pAVar12,BVar10,tmp_buf_,(uint8_t *)rd_stats)
    ;
  }
LAB_00346ed4:
  lVar17 = (long)*(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.u_round_fp[0x8a] +
                         local_10d8 * 4 + 6) +
           (long)*(int *)((long)(((AV1_COMP *)x)->enc_quant_dequant_params).quants.u_round_fp[0x30]
                         + (long)mbmi_00->interintra_wedge_index * 4 +
                           (ulong)(uint)((int)local_10d8 << 6) + 8) +
           (long)*(int *)((long)local_1100 + (ulong)mbmi_00->interintra_mode * 2 * 2);
  lVar15 = ((long)*(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4)
            * (*rate_mv + lVar17) + 0x100 >> 9) + local_1098;
  iVar11 = mbmi_00->mv[0];
  local_1100 = (AV1_COMP *)(long)(int)lVar17;
  if ((mbmi_00->mode < 0x19) && ((0x1790000U >> (mbmi_00->mode & 0x1f) & 1) != 0)) {
    local_10e8 = (uint8_t *)CONCAT44(local_10e8._4_4_,iVar11.as_int);
    iVar9 = (int)local_10e0;
    av1_compound_single_motion_search
              (cpi,x,(BLOCK_SIZE)local_1128,&tmp_mv.as_mv,dst,
               *(uint8_t **)
                (*(long *)((long)&av1_wedge_params_lookup[0].masks +
                          (ulong)(uint)((int)local_10d8 << 5)) + 0x80 +
                (long)mbmi_00->interintra_wedge_index * 8),iVar9,&tmp_rate_mv,0);
    if (mbmi_00->mv[0].as_int == tmp_mv.as_int) {
      dst = local_10c0;
      iVar11.as_int = local_10e8._0_4_;
      goto LAB_003470d8;
    }
    mbmi_00->mv[0] = tmp_mv;
    mbmi_00->ref_frame[1] = -1;
    av1_enc_build_inter_predictor
              (local_1108,(MACROBLOCKD *)local_1118,
               *(int *)(((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant[0x19],
               *(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant[0x19] + 2),
               orig_dst,(BLOCK_SIZE)local_1128,0,0);
    mbmi_00->ref_frame[1] = '\0';
    av1_combine_interintra
              ((MACROBLOCKD *)local_1118,(BLOCK_SIZE)local_1128,0,
               *(uint8_t **)(((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant[0x1b],
               *(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant[0x1c] + 4),
               local_10c0,iVar9);
    model_rd_for_sb_with_curvfit
              (local_1128,(BLOCK_SIZE)x,local_1118,(MACROBLOCKD *)0x0,0,(int)&rate_sum,
               (int *)&best_interintra_rd,(int64_t *)&skip_txfm_sb,(uint8_t *)&skip_sse_sb,
               (int64_t *)0x0,(int *)0x0,(int64_t *)0x0,in_stack_ffffffffffffeec8);
    uVar7 = (long)((local_1100->enc_quant_dequant_params).quants.y_quant + -1) + (long)tmp_rate_mv;
    lVar5 = (long)*(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4);
    dst = local_10c0;
    iVar11.as_int = local_10e8._0_4_;
    if (lVar15 <= best_interintra_rd * 0x80 +
                  ((long)(((long)rate_sum + uVar7) * lVar5 + 0x100) >> 9)) goto LAB_003470d8;
  }
  else {
LAB_003470d8:
    tmp_rate_mv = *rate_mv;
    tmp_mv = iVar11;
    av1_combine_interintra
              ((MACROBLOCKD *)local_1118,(BLOCK_SIZE)local_1128,0,local_10a0,(int)local_10e0,dst,
               (int)local_10e0);
    lVar5 = (long)*(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4);
    uVar7 = (ulong)(uint)(tmp_rate_mv + (int)lVar17);
  }
  iVar6 = estimate_yrd_for_sb(cpi,(BLOCK_SIZE)local_1128,x,
                              local_1088 - ((int)uVar7 * lVar5 + 0x100 >> 9),
                              (RD_STATS *)&best_interintra_rd);
  lVar5 = local_1088;
  if (iVar6 == 0x7fffffffffffffff) {
    lVar8 = 0x7fffffffffffffff;
    if (lVar15 == 0x7fffffffffffffff) {
      return -1;
    }
  }
  else {
    lVar8 = (long)puStack_1070 * 0x80 +
            ((long)*(int *)((((AV1_COMP *)x)->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4)
             * ((long)((local_1100->enc_quant_dequant_params).quants.y_quant + -1) +
               (long)(int)best_interintra_rd + (long)tmp_rate_mv) + 0x100 >> 9);
  }
LAB_003471b5:
  iVar9 = (int)lVar17;
  if ((lVar5 == 0x7fffffffffffffff) && (lVar8 == 0x7fffffffffffffff)) {
    return -1;
  }
  if (lVar8 < lVar5) {
    mbmi_00->mv[0] = tmp_mv;
    *tmp_rate2 = *tmp_rate2 + (tmp_rate_mv - *rate_mv);
    *rate_mv = tmp_rate_mv;
  }
  else {
    if ((local_1129 & (byte)local_10f8) == 1) {
      mbmi_00->field_0xa8 = mbmi_00->field_0xa8 & 0xfb;
      mbmi_00->interintra_mode = local_112b;
      mbmi_00->mv[0] = local_108c;
      av1_enc_build_inter_predictor
                (local_1108,(MACROBLOCKD *)local_1118,local_10ac,local_10b0,orig_dst,
                 (BLOCK_SIZE)local_1128,0,0);
    }
    iVar9 = (int)local_10b8;
  }
  *tmp_rate2 = *tmp_rate2 + iVar9;
  if (local_1119 == '\0') {
    av1_enc_build_inter_predictor
              (local_1108,(MACROBLOCKD *)local_1118,local_10ac,local_10b0,orig_dst,
               (BLOCK_SIZE)local_1128,1,2);
    return 0;
  }
  return 0;
}

Assistant:

int av1_handle_inter_intra_mode(const AV1_COMP *const cpi, MACROBLOCK *const x,
                                BLOCK_SIZE bsize, MB_MODE_INFO *mbmi,
                                HandleInterModeArgs *args, int64_t ref_best_rd,
                                int *rate_mv, int *tmp_rate2,
                                const BUFFER_SET *orig_dst) {
  const int try_smooth_interintra =
      cpi->oxcf.comp_type_cfg.enable_smooth_interintra;

  const int is_wedge_used = av1_is_wedge_used(bsize);
  const int try_wedge_interintra =
      is_wedge_used && enable_wedge_interintra_search(x, cpi);

  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int bw = block_size_wide[bsize];
  DECLARE_ALIGNED(16, uint8_t, tmp_buf_[2 * MAX_INTERINTRA_SB_SQUARE]);
  DECLARE_ALIGNED(16, uint8_t, intrapred_[2 * MAX_INTERINTRA_SB_SQUARE]);
  uint8_t *tmp_buf = get_buf_by_bd(xd, tmp_buf_);
  uint8_t *intrapred = get_buf_by_bd(xd, intrapred_);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Single reference inter prediction
  mbmi->ref_frame[1] = NONE_FRAME;
  xd->plane[0].dst.buf = tmp_buf;
  xd->plane[0].dst.stride = bw;
  av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                AOM_PLANE_Y, AOM_PLANE_Y);
  const int num_planes = av1_num_planes(cm);

  // Restore the buffers for intra prediction
  restore_dst_buf(xd, *orig_dst, num_planes);
  mbmi->ref_frame[1] = INTRA_FRAME;
  INTERINTRA_MODE best_interintra_mode =
      args->inter_intra_mode[mbmi->ref_frame[0]];

  // Compute smooth_interintra
  int64_t best_interintra_rd_nowedge = INT64_MAX;
  int best_mode_rate = INT_MAX;
  if (try_smooth_interintra) {
    int ret = handle_smooth_inter_intra_mode(
        cpi, x, bsize, mbmi, ref_best_rd, rate_mv, &best_interintra_mode,
        &best_interintra_rd_nowedge, &best_mode_rate, orig_dst, tmp_buf,
        intrapred, args);
    if (ret == IGNORE_MODE) {
      return IGNORE_MODE;
    }
  }

  // Compute wedge interintra
  int64_t best_interintra_rd_wedge = INT64_MAX;
  const int_mv mv0 = mbmi->mv[0];
  int_mv tmp_mv = mv0;
  int tmp_rate_mv = 0;
  int rate_overhead = 0;
  if (try_wedge_interintra) {
    int ret = handle_wedge_inter_intra_mode(
        cpi, x, bsize, mbmi, rate_mv, &best_interintra_mode,
        &best_interintra_rd_wedge, orig_dst, tmp_buf_, tmp_buf, intrapred_,
        intrapred, args, &tmp_rate_mv, &rate_overhead, &tmp_mv,
        best_interintra_rd_nowedge);
    if (ret == IGNORE_MODE) {
      return IGNORE_MODE;
    }
  }

  if (best_interintra_rd_nowedge == INT64_MAX &&
      best_interintra_rd_wedge == INT64_MAX) {
    return IGNORE_MODE;
  }
  if (best_interintra_rd_wedge < best_interintra_rd_nowedge) {
    mbmi->mv[0].as_int = tmp_mv.as_int;
    *tmp_rate2 += tmp_rate_mv - *rate_mv;
    *rate_mv = tmp_rate_mv;
    best_mode_rate = rate_overhead;
  } else if (try_smooth_interintra && try_wedge_interintra) {
    // If smooth was best, but we over-wrote the values when evaluating the
    // wedge mode, we need to recompute the smooth values.
    mbmi->use_wedge_interintra = 0;
    mbmi->interintra_mode = best_interintra_mode;
    mbmi->mv[0].as_int = mv0.as_int;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
  *tmp_rate2 += best_mode_rate;

  if (num_planes > 1) {
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_U, num_planes - 1);
  }
  return 0;
}